

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall HFactor::update(HFactor *this,HVector *aq,HVector *ep,HighsInt *iRow,HighsInt *hint)

{
  int iVar1;
  
  RefactorInfo::clear(&this->refactor_info_);
  if (aq->next != (HVectorBase<double> *)0x0) {
    updateCFT(this,aq,ep,iRow);
    return;
  }
  iVar1 = this->update_method;
  if (iVar1 == 1) {
    updateFT(this,aq,ep,*iRow);
    iVar1 = this->update_method;
  }
  if (iVar1 == 2) {
    updatePF(this,aq,*iRow,hint);
    iVar1 = this->update_method;
  }
  if (iVar1 == 3) {
    updateMPF(this,aq,ep,*iRow,hint);
    iVar1 = this->update_method;
  }
  if (iVar1 == 4) {
    updateAPF(this,aq,ep,*iRow);
    return;
  }
  return;
}

Assistant:

void HFactor::update(HVector* aq, HVector* ep, HighsInt* iRow, HighsInt* hint) {
  // Updating implies a change of basis. Since the refactorizaion info
  // no longer corresponds to the current basis, it must be
  // invalidated
  this->refactor_info_.clear();
  // Special case
  if (aq->next) {
    updateCFT(aq, ep, iRow);
    return;
  }

  if (update_method == kUpdateMethodFt) updateFT(aq, ep, *iRow);
  if (update_method == kUpdateMethodPf) updatePF(aq, *iRow, hint);
  if (update_method == kUpdateMethodMpf) updateMPF(aq, ep, *iRow, hint);
  if (update_method == kUpdateMethodApf) updateAPF(aq, ep, *iRow);
}